

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_448ecb::QualType::printLeft(QualType *this,OutputStream *S)

{
  (*this->Child->_vptr_Node[4])();
  if (((this->super_Node).field_0xc & 1) != 0) {
    OutputStream::grow(S,6);
    builtin_strncpy(S->Buffer + S->CurrentPosition," const",6);
    S->CurrentPosition = S->CurrentPosition + 6;
  }
  if (((this->super_Node).field_0xc & 2) != 0) {
    OutputStream::grow(S,9);
    builtin_strncpy(S->Buffer + S->CurrentPosition," volatile",9);
    S->CurrentPosition = S->CurrentPosition + 9;
  }
  if (((this->super_Node).field_0xc & 4) != 0) {
    OutputStream::grow(S,9);
    builtin_strncpy(S->Buffer + S->CurrentPosition," restrict",9);
    S->CurrentPosition = S->CurrentPosition + 9;
  }
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    Child->printLeft(S);
    printQuals(S);
  }